

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O2

LispPTR N_OP_cdr(LispPTR tos)

{
  uint datum;
  uint uVar1;
  LispPTR *pLVar2;
  LispPTR LVar3;
  
  LVar3 = 0;
  if (tos != 0) {
    if ((*(ushort *)((ulong)(tos >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) {
      pLVar2 = NativeAligned4FromLAddr(tos);
      datum = *pLVar2;
      uVar1 = datum >> 0x1c;
      if (uVar1 != 8) {
        if (datum < 0x90000000) {
          if (datum < 0x10000000) {
            LVar3 = cdr(datum);
            return LVar3;
          }
          pLVar2 = NativeAligned4FromLAddr(tos + uVar1 * 2);
          LVar3 = *pLVar2 & 0xfffffff;
        }
        else {
          LVar3 = tos + (uVar1 & 7) * 2;
        }
      }
    }
    else {
      MachineState.errorexit = 1;
      LVar3 = 0xffffffff;
      MachineState.tosvalue = tos;
    }
  }
  return LVar3;
}

Assistant:

LispPTR N_OP_cdr(LispPTR tos) {
  ConsCell *datum68k;
  DLword cdr_code;

  if (tos == NIL_PTR) return (tos);
  if (!Listp(tos)) {
      ERROR_EXIT(tos);
  }

  datum68k = (ConsCell *)(NativeAligned4FromLAddr(tos));
  cdr_code = datum68k->cdr_code;

    if (cdr_code == CDR_NIL) return (NIL_PTR); /* cdr-nil */
    if (cdr_code > CDR_ONPAGE) /* cdr-samepage */
#ifdef NEWCDRCODING
      return (tos + ((cdr_code & 7) << 1));
#else
      return (POINTER_PAGEBASE(tos) + ((cdr_code & 127) << 1));
#endif                                 /*NEWCDRCODING */
    if (cdr_code == CDR_INDIRECT) /* cdr-indirect */
      return (cdr((LispPTR)(datum68k->car_field)));
    /* cdr-differentpage */
#ifdef NEWCDRCODING
    return ((LispPTR)((ConsCell *)(NativeAligned4FromLAddr(tos + (cdr_code << 1))))->car_field);
#else
    return ((LispPTR)((ConsCell *)(NativeAligned4FromLAddr(POINTER_PAGEBASE(tos) + (cdr_code << 1))))->car_field);
#endif /*NEWCDRCODING */
}